

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

void __thiscall Spi::flash_64kB_sector_erase(Spi *this,int addr)

{
  uint8_t command [4];
  uint8_t local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  if (this->verbose == true) {
    fprintf(_stdout,"erase 64kB sector at 0x%06X..\n",addr);
  }
  local_1c = 0xd8;
  local_1b = (undefined1)((uint)addr >> 0x10);
  local_1a = (undefined1)((uint)addr >> 8);
  local_19 = (undefined1)addr;
  set_gpio(this,0,0);
  send_spi(this,&local_1c,4);
  set_gpio(this,1,0);
  return;
}

Assistant:

void Spi::flash_64kB_sector_erase(int addr) {
	if (verbose)
		fprintf(stdout, "erase 64kB sector at 0x%06X..\n", addr);

	uint8_t command[4] = { FC_BE64, (uint8_t) (addr >> 16),
			(uint8_t) (addr >> 8), (uint8_t) addr };

	flash_chip_select();
	send_spi(command, 4);
	flash_chip_deselect();
}